

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

int Saig_ManDemiterSimpleDiff_old(Aig_Man_t *p,Aig_Man_t **ppAig0,Aig_Man_t **ppAig1)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Man_t *pAVar3;
  char *pcVar4;
  uint local_54;
  int Counter;
  int i;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vSet1;
  Vec_Ptr_t *vSet0;
  Aig_Man_t **ppAig1_local;
  Aig_Man_t **ppAig0_local;
  Aig_Man_t *p_local;
  
  vSet0 = (Vec_Ptr_t *)ppAig1;
  ppAig1_local = ppAig0;
  ppAig0_local = (Aig_Man_t **)p;
  iVar1 = Saig_ManPoNum(p);
  vSet1 = Vec_PtrAlloc(iVar1);
  iVar1 = Saig_ManPoNum((Aig_Man_t *)ppAig0_local);
  pObj = (Aig_Obj_t *)Vec_PtrAlloc(iVar1);
  for (local_54 = 0; iVar1 = Saig_ManPoNum((Aig_Man_t *)ppAig0_local), (int)local_54 < iVar1;
      local_54 = local_54 + 1) {
    pFanin = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)ppAig0_local[3],local_54);
    pObj0 = Aig_ObjFanin0(pFanin);
    iVar1 = Aig_ObjIsConst1(pObj0);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsNode(pObj0);
      if ((iVar1 == 0) ||
         (iVar1 = Aig_ObjRecognizeExor(pObj0,&pObj1,(Aig_Obj_t **)&Counter), iVar1 == 0)) {
        printf("The output number %d cannot be demitered.\n",(ulong)local_54);
      }
      else {
        iVar1 = Aig_ObjFaninC0(pFanin);
        if (iVar1 != 0) {
          pObj1 = Aig_Not(pObj1);
        }
        pAVar2 = Aig_Regular(pObj1);
        iVar1 = pAVar2->Id;
        pAVar2 = Aig_Regular(_Counter);
        if (iVar1 < pAVar2->Id) {
          Vec_PtrPush(vSet1,pObj1);
          Vec_PtrPush((Vec_Ptr_t *)pObj,_Counter);
        }
        else {
          Vec_PtrPush(vSet1,_Counter);
          Vec_PtrPush((Vec_Ptr_t *)pObj,pObj1);
        }
      }
    }
    else {
      iVar1 = Aig_ObjFaninC0(pFanin);
      if (iVar1 == 0) {
        printf("The output number %d of the miter is constant 1.\n",(ulong)local_54);
      }
    }
  }
  if (ppAig1_local != (Aig_Man_t **)0x0) {
    pAVar3 = Aig_ManDupNodesAll((Aig_Man_t *)ppAig0_local,vSet1);
    *ppAig1_local = pAVar3;
    if ((*ppAig1_local)->pName != (char *)0x0) {
      free((*ppAig1_local)->pName);
      (*ppAig1_local)->pName = (char *)0x0;
    }
    pcVar4 = Abc_UtilStrsav("part0");
    (*ppAig1_local)->pName = pcVar4;
  }
  if (vSet0 != (Vec_Ptr_t *)0x0) {
    pAVar3 = Aig_ManDupNodesAll((Aig_Man_t *)ppAig0_local,(Vec_Ptr_t *)pObj);
    *(Aig_Man_t **)vSet0 = pAVar3;
    if (**(long **)vSet0 != 0) {
      free((void *)**(undefined8 **)vSet0);
      **(undefined8 **)vSet0 = 0;
    }
    pcVar4 = Abc_UtilStrsav("part1");
    **(undefined8 **)vSet0 = pcVar4;
  }
  Vec_PtrFree(vSet1);
  Vec_PtrFree((Vec_Ptr_t *)pObj);
  return 1;
}

Assistant:

int Saig_ManDemiterSimpleDiff_old( Aig_Man_t * p, Aig_Man_t ** ppAig0, Aig_Man_t ** ppAig1 )
{
    Vec_Ptr_t * vSet0, * vSet1;
    Aig_Obj_t * pObj, * pFanin, * pObj0, * pObj1;
    int i, Counter = 0;
//    assert( Saig_ManRegNum(p) % 2 == 0 );
    vSet0 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    vSet1 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    Saig_ManForEachPo( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsConst1( pFanin ) )
        {
            if ( !Aig_ObjFaninC0(pObj) )
                printf( "The output number %d of the miter is constant 1.\n", i );
            Counter++;
            continue;
        } 
        if ( !Aig_ObjIsNode(pFanin) || !Aig_ObjRecognizeExor( pFanin, &pObj0, &pObj1 ) )
        {
/*
            printf( "The miter cannot be demitered.\n" );
            Vec_PtrFree( vSet0 );
            Vec_PtrFree( vSet1 );
            return 0;
*/
            printf( "The output number %d cannot be demitered.\n", i );
            continue;
        }
        if ( Aig_ObjFaninC0(pObj) )
            pObj0 = Aig_Not(pObj0);

//        printf( "%d %d  ", Aig_Regular(pObj0)->Id, Aig_Regular(pObj1)->Id );
        if ( Aig_Regular(pObj0)->Id < Aig_Regular(pObj1)->Id )
        {
            Vec_PtrPush( vSet0, pObj0 );
            Vec_PtrPush( vSet1, pObj1 );
        }
        else
        {
            Vec_PtrPush( vSet0, pObj1 );
            Vec_PtrPush( vSet1, pObj0 );
        }
    }
//    printf( "Miter has %d constant outputs.\n", Counter );
//    printf( "\n" );
    if ( ppAig0 )
    {
        *ppAig0 = Aig_ManDupNodesAll( p, vSet0 );
        ABC_FREE( (*ppAig0)->pName );
        (*ppAig0)->pName = Abc_UtilStrsav( "part0" );
    }
    if ( ppAig1 )
    {
        *ppAig1 = Aig_ManDupNodesAll( p, vSet1 );
        ABC_FREE( (*ppAig1)->pName );
        (*ppAig1)->pName = Abc_UtilStrsav( "part1" );
    }
    Vec_PtrFree( vSet0 );
    Vec_PtrFree( vSet1 );
    return 1;
}